

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

uint __thiscall
covenant::DFA_impl::
StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *es,
          bool accept,uint base)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  StateEntry *pSVar3;
  _Rb_tree_node_base *p_Var4;
  node_pointer ppVar5;
  int iVar6;
  ulong uVar7;
  emplace_return eVar8;
  StateEntry *entry;
  
  iVar6 = this->tempsz;
  iVar2 = (int)(es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (iVar6 < iVar2) {
    while (iVar6 < iVar2) {
      iVar6 = iVar6 * 2;
      this->tempsz = iVar6;
    }
    pSVar3 = (StateEntry *)realloc(this->temp,(long)(iVar6 * 2) * 4 + 8);
    this->temp = pSVar3;
    iVar2 = (int)(es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    pSVar3 = this->temp;
  }
  pSVar3->sz = iVar2 + 1;
  pSVar3->data[0] = (uint)accept;
  p_Var4 = (es->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(es->_M_t)._M_impl.super__Rb_tree_header;
  uVar7 = 1;
  while ((_Rb_tree_header *)p_Var4 != p_Var1) {
    pSVar3->data[uVar7] = p_Var4[1]._M_color;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  ppVar5 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>,_const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry>_>
           ::find_node(&(this->cache).table_,&this->temp);
  if (ppVar5 == (node_pointer)0x0) {
    entry = (StateEntry *)malloc((es->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 8 + 8);
    std::
    vector<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
    ::push_back(&this->entries,&entry);
    pSVar3 = entry;
    entry->sz = (int)(es->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 1;
    entry->data[0] = (uint)accept;
    p_Var4 = (es->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar7 = 1;
    while ((_Rb_tree_header *)p_Var4 != p_Var1) {
      pSVar3->data[uVar7] = p_Var4[1]._M_color;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    eVar8 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
            ::
            try_emplace_unique<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
                        *)&this->cache,&entry);
    *(uint *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 8) = base;
  }
  else {
    base = *(uint *)((long)&(ppVar5->value_base_).data_.data_ + 8);
  }
  return base;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }